

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_service.cc
# Opt level: O0

void google::protobuf::compiler::cpp::anon_unknown_3::InitMethodVariables
               (MethodDescriptor *method,Options *options,Formatter *format)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  MethodDescriptor *in_RDI;
  string *key;
  Options *in_stack_ffffffffffffff20;
  Descriptor *in_stack_ffffffffffffff28;
  allocator local_b9;
  string local_b8 [32];
  string local_98 [39];
  allocator local_71;
  string local_70 [55];
  undefined1 local_39 [49];
  MethodDescriptor *local_8;
  
  key = (string *)local_39;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_39 + 1),"name",(allocator *)key);
  MethodDescriptor::name_abi_cxx11_(local_8);
  Formatter::Set<std::__cxx11::string>((Formatter *)in_stack_ffffffffffffff20,key,in_RDX);
  std::__cxx11::string::~string((string *)(local_39 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"input_type",&local_71);
  MethodDescriptor::input_type((MethodDescriptor *)0x5215d7);
  QualifiedClassName_abi_cxx11_(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  Formatter::Set<std::__cxx11::string>((Formatter *)in_stack_ffffffffffffff20,key,in_RDX);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"output_type",&local_b9);
  MethodDescriptor::output_type((MethodDescriptor *)0x52167e);
  QualifiedClassName_abi_cxx11_(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  Formatter::Set<std::__cxx11::string>((Formatter *)in_stack_ffffffffffffff20,key,in_RDX);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  return;
}

Assistant:

void InitMethodVariables(const MethodDescriptor* method, const Options& options,
                         Formatter* format) {
  format->Set("name", method->name());
  format->Set("input_type", QualifiedClassName(method->input_type(), options));
  format->Set("output_type",
              QualifiedClassName(method->output_type(), options));
}